

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

BOOL list_overlap(List *l1,List *l2)

{
  BOOL BVar1;
  
  while( true ) {
    BVar1 = FALSE;
    if (((l1 == (List *)0x0) || (BVar1 = FALSE, l2 == (List *)0x0)) || (BVar1 = TRUE, l1 == l2)) {
      return BVar1;
    }
    BVar1 = list_overlap(l1,l2->car);
    if (BVar1 != FALSE) {
      return TRUE;
    }
    BVar1 = list_overlap(l1,l2->cdr);
    if (BVar1 != FALSE) break;
    BVar1 = list_overlap(l1->car,l2);
    if (BVar1 != FALSE) {
      return TRUE;
    }
    l1 = l1->cdr;
  }
  return TRUE;
}

Assistant:

BOOL
list_overlap (const List *l1, const List *l2)
{
  if (l1 == NULL || l2 == NULL)
    return FALSE;
  if (l1 == l2)
    return TRUE;
  return (list_overlap (l1, l2->car)
	  || list_overlap (l1, l2->cdr)
	  || list_overlap (l1->car, l2)
	  || list_overlap (l1->cdr, l2));
}